

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_light.cpp
# Opt level: O2

Vector2D __thiscall
CGL::SceneObjects::EnvironmentLight::dir_to_theta_phi(EnvironmentLight *this,Vector3D *dir)

{
  Vector3D *in_RDX;
  _func_int **pp_Var1;
  double dVar2;
  Vector2D VVar3;
  Vector3D unit_dir;
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_38;
  
  Vector3D::unit((Vector3D *)&local_38.field_0,in_RDX);
  pp_Var1 = (_func_int **)acos(local_38.field_0.y);
  dVar2 = atan2(-local_38.field_0.z,local_38.field_0.x);
  (this->super_SceneLight)._vptr_SceneLight = pp_Var1;
  this->envMap = (HDRImageBuffer *)(dVar2 + 3.141592653589793);
  VVar3.y = (double)pp_Var1;
  VVar3.x = dVar2 + 3.141592653589793;
  return VVar3;
}

Assistant:

Vector2D EnvironmentLight::dir_to_theta_phi(const Vector3D dir) const {
    Vector3D unit_dir = dir.unit();
    double theta = acos(unit_dir.y);
    double phi = atan2(-unit_dir.z, unit_dir.x) + PI;
    return Vector2D(theta, phi);
  }